

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void helper_rfm(CPUTriCoreState *env)

{
  uint32_t uVar1;
  int iVar2;
  CPUTriCoreState *env_local;
  
  env->PC = env->gpr_a[0xb] & 0xfffffffe;
  env->ICR = env->ICR & 0xfffffeff | (env->PCXI & 0x800000) >> 0xf;
  env->ICR = env->ICR & 0xffffff00 | env->PCXI >> 0x18;
  uVar1 = cpu_ldl_data_tricore(env,env->DCX);
  env->PCXI = uVar1;
  uVar1 = cpu_ldl_data_tricore(env,env->DCX + 4);
  psw_write(env,uVar1);
  uVar1 = cpu_ldl_data_tricore(env,env->DCX + 8);
  env->gpr_a[10] = uVar1;
  uVar1 = cpu_ldl_data_tricore(env,env->DCX + 0xc);
  env->gpr_a[0xb] = uVar1;
  iVar2 = tricore_feature(env,1);
  if (iVar2 != 0) {
    env->DBGTCR = 0;
  }
  return;
}

Assistant:

void helper_rfm(CPUTriCoreState *env)
{
    env->PC = (env->gpr_a[11] & ~0x1);
    /* ICR.IE = PCXI.PIE; */
    env->ICR = (env->ICR & ~MASK_ICR_IE_1_3)
            | ((env->PCXI & MASK_PCXI_PIE_1_3) >> 15);
    /* ICR.CCPN = PCXI.PCPN; */
    env->ICR = (env->ICR & ~MASK_ICR_CCPN) |
               ((env->PCXI & MASK_PCXI_PCPN) >> 24);
    /* {PCXI, PSW, A[10], A[11]} = M(DCX, 4 * word); */
    env->PCXI = cpu_ldl_data(env, env->DCX);
    psw_write(env, cpu_ldl_data(env, env->DCX+4));
    env->gpr_a[10] = cpu_ldl_data(env, env->DCX+8);
    env->gpr_a[11] = cpu_ldl_data(env, env->DCX+12);

    if (tricore_feature(env, TRICORE_FEATURE_131)) {
        env->DBGTCR = 0;
    }
}